

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O1

void __thiscall Assimp::XFileParser::ParseDataObjectMesh(XFileParser *this,Mesh *pMesh)

{
  pointer *ppuVar1;
  pointer paVar2;
  iterator __position;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  Logger *this_00;
  char *pcVar9;
  long lVar10;
  ulong uVar11;
  pointer this_01;
  aiVector3D aVar12;
  string objectName;
  string name;
  string local_90;
  string local_70;
  string local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  readHeadOfDataObject(this,&local_70);
  uVar3 = ReadInt(this);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
            (&pMesh->mPositions,(ulong)uVar3);
  if (uVar3 != 0) {
    lVar10 = 0;
    do {
      aVar12 = ReadVector3(this);
      paVar2 = (pMesh->mPositions).
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      *(long *)((long)&paVar2->x + lVar10) = aVar12._0_8_;
      *(float *)((long)&paVar2->z + lVar10) = aVar12.z;
      lVar10 = lVar10 + 0xc;
    } while ((ulong)uVar3 * 0xc != lVar10);
  }
  uVar4 = ReadInt(this);
  std::vector<Assimp::XFile::Face,_std::allocator<Assimp::XFile::Face>_>::resize
            (&pMesh->mPosFaces,(ulong)uVar4);
  if (uVar4 != 0) {
    uVar11 = 0;
    do {
      uVar5 = ReadInt(this);
      if (uVar5 != 0) {
        this_01 = (pMesh->mPosFaces).
                  super__Vector_base<Assimp::XFile::Face,_std::allocator<Assimp::XFile::Face>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar11;
        do {
          uVar6 = ReadInt(this);
          if (uVar6 <= uVar3) {
            __position._M_current =
                 (this_01->mIndices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_90._M_dataplus._M_p._0_4_ = uVar6;
            if (__position._M_current ==
                (this_01->mIndices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>(&this_01->mIndices,__position,(uint *)&local_90);
            }
            else {
              *__position._M_current = uVar6;
              ppuVar1 = &(this_01->mIndices).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppuVar1 = *ppuVar1 + 1;
            }
          }
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      TestForSeparator(this);
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar4);
  }
  do {
    GetNextToken_abi_cxx11_(&local_90,this);
    if (local_90._M_string_length == 0) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Unexpected end of file while parsing mesh structure","");
      ThrowException(this,&local_50);
    }
    iVar7 = std::__cxx11::string::compare((char *)&local_90);
    if (iVar7 != 0) {
      iVar8 = std::__cxx11::string::compare((char *)&local_90);
      if (iVar8 == 0) {
        ParseDataObjectMeshNormals(this,pMesh);
      }
      else {
        iVar8 = std::__cxx11::string::compare((char *)&local_90);
        if (iVar8 == 0) {
          ParseDataObjectMeshTextureCoords(this,pMesh);
        }
        else {
          iVar8 = std::__cxx11::string::compare((char *)&local_90);
          if (iVar8 == 0) {
            ParseDataObjectMeshVertexColors(this,pMesh);
          }
          else {
            iVar8 = std::__cxx11::string::compare((char *)&local_90);
            if (iVar8 == 0) {
              ParseDataObjectMeshMaterialList(this,pMesh);
            }
            else {
              iVar8 = std::__cxx11::string::compare((char *)&local_90);
              if (iVar8 == 0) {
LAB_006340fb:
                ParseUnknownDataObject(this);
              }
              else {
                pcVar9 = "XSkinMeshHeader";
                iVar8 = std::__cxx11::string::compare((char *)&local_90);
                if (iVar8 == 0) {
                  ParseDataObjectSkinMeshHeader(this,(Mesh *)pcVar9);
                }
                else {
                  iVar8 = std::__cxx11::string::compare((char *)&local_90);
                  if (iVar8 != 0) {
                    this_00 = DefaultLogger::get();
                    Logger::warn(this_00,"Unknown data object in mesh in x file");
                    goto LAB_006340fb;
                  }
                  ParseDataObjectSkinWeights(this,pMesh);
                }
              }
            }
          }
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_90._M_dataplus._M_p._4_4_,(uint)local_90._M_dataplus._M_p) !=
        &local_90.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_90._M_dataplus._M_p._4_4_,(uint)local_90._M_dataplus._M_p));
    }
    if (iVar7 == 0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      return;
    }
  } while( true );
}

Assistant:

void XFileParser::ParseDataObjectMesh( Mesh* pMesh)
{
    std::string name;
    readHeadOfDataObject( &name);

    // read vertex count
    unsigned int numVertices = ReadInt();
    pMesh->mPositions.resize( numVertices);

    // read vertices
    for( unsigned int a = 0; a < numVertices; a++)
        pMesh->mPositions[a] = ReadVector3();

    // read position faces
    unsigned int numPosFaces = ReadInt();
    pMesh->mPosFaces.resize( numPosFaces);
    for( unsigned int a = 0; a < numPosFaces; ++a) {
        // read indices
        unsigned int numIndices = ReadInt();
        Face& face = pMesh->mPosFaces[a];
        for (unsigned int b = 0; b < numIndices; ++b) {
            const int idx( ReadInt() );
            if ( static_cast<unsigned int>( idx ) <= numVertices ) {
                face.mIndices.push_back( idx );
            }
        }
        TestForSeparator();
    }

    // here, other data objects may follow
    bool running = true;
    while ( running ) {
        std::string objectName = GetNextToken();

        if( objectName.empty() )
            ThrowException( "Unexpected end of file while parsing mesh structure");
        else
        if( objectName == "}")
            break; // mesh finished
        else
        if( objectName == "MeshNormals")
            ParseDataObjectMeshNormals( pMesh);
        else
        if( objectName == "MeshTextureCoords")
            ParseDataObjectMeshTextureCoords( pMesh);
        else
        if( objectName == "MeshVertexColors")
            ParseDataObjectMeshVertexColors( pMesh);
        else
        if( objectName == "MeshMaterialList")
            ParseDataObjectMeshMaterialList( pMesh);
        else
        if( objectName == "VertexDuplicationIndices")
            ParseUnknownDataObject(); // we'll ignore vertex duplication indices
        else
        if( objectName == "XSkinMeshHeader")
            ParseDataObjectSkinMeshHeader( pMesh);
        else
        if( objectName == "SkinWeights")
            ParseDataObjectSkinWeights( pMesh);
        else
        {
            ASSIMP_LOG_WARN("Unknown data object in mesh in x file");
            ParseUnknownDataObject();
        }
    }
}